

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

wchar_t canBzip2(void)

{
  wchar_t wVar1;
  
  if (canBzip2_tested == '\0') {
    canBzip2_tested = '\x01';
    wVar1 = systemf("bzip2 -d -V %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canBzip2_value = 1;
    }
  }
  return (uint)canBzip2_value;
}

Assistant:

int
canBzip2(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("bzip2 -d -V %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}